

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O2

void __thiscall bsplib::A2A::clear(A2A *this)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  int p;
  long lVar6;
  
  iVar1 = this->m_nprocs;
  puVar2 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    puVar2[lVar6] = 0;
    puVar3[lVar6] = 0;
    puVar5[lVar6] = 0;
    puVar4[lVar6] = 0;
  }
  return;
}

Assistant:

void A2A :: clear()
{
    for (int p = 0 ; p < m_nprocs; ++p ) {
        m_recv_sizes[p] = 0;
        m_send_sizes[p] = 0;
        m_recv_pos[p] = 0;
        m_send_pos[p] = 0;
    }
}